

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

char * find_host_sep(char *url)

{
  char *pcVar1;
  size_t sVar2;
  char *local_38;
  char *local_20;
  char *query;
  char *sep;
  char *url_local;
  
  pcVar1 = strstr(url,"//");
  query = url;
  if (pcVar1 != (char *)0x0) {
    query = pcVar1 + 2;
  }
  local_20 = strchr(query,0x3f);
  query = strchr(query,0x2f);
  if (query == (char *)0x0) {
    sVar2 = strlen(url);
    query = url + sVar2;
  }
  if (local_20 == (char *)0x0) {
    sVar2 = strlen(url);
    local_20 = url + sVar2;
  }
  if (query < local_20) {
    local_38 = query;
  }
  else {
    local_38 = local_20;
  }
  return local_38;
}

Assistant:

static const char *find_host_sep(const char *url)
{
  const char *sep;
  const char *query;

  /* Find the start of the hostname */
  sep = strstr(url, "//");
  if(!sep)
    sep = url;
  else
    sep += 2;

  query = strchr(sep, '?');
  sep = strchr(sep, '/');

  if(!sep)
    sep = url + strlen(url);

  if(!query)
    query = url + strlen(url);

  return sep < query ? sep : query;
}